

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm_sse4.h
# Opt level: O0

void av1_round_shift_array_32_sse4_1(__m128i *input,__m128i *output,int size,int bit)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  int *piVar4;
  uint in_ECX;
  int iVar5;
  longlong in_RDX;
  long in_RSI;
  long lVar6;
  long in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  __m128i alVar7;
  int i_1;
  int i;
  int local_40;
  int local_3c;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  
  iVar5 = (int)in_RDX;
  if ((int)in_ECX < 1) {
    for (local_40 = 0; local_40 < iVar5; local_40 = local_40 + 1) {
      puVar3 = (undefined8 *)(in_RDI + (long)local_40 * 0x10);
      uVar1 = *puVar3;
      uVar2 = puVar3[1];
      local_18 = (int)uVar1;
      iStack_14 = (int)((ulong)uVar1 >> 0x20);
      iStack_10 = (int)uVar2;
      iStack_c = (int)((ulong)uVar2 >> 0x20);
      piVar4 = (int *)(in_RSI + (long)local_40 * 0x10);
      *piVar4 = local_18 << -in_ECX;
      piVar4[1] = iStack_14;
      piVar4[2] = iStack_10;
      piVar4[3] = iStack_c;
    }
  }
  else {
    lVar6 = in_RSI;
    for (local_3c = 0; local_3c < iVar5; local_3c = local_3c + 1) {
      alVar7[0] = (ulong)in_ECX;
      alVar7[1] = lVar6;
      alVar7 = av1_round_shift_32_sse4_1(alVar7,(int)in_RDX);
      in_RDX = alVar7[1];
      puVar3 = (undefined8 *)(in_RSI + (long)local_3c * 0x10);
      *puVar3 = extraout_XMM0_Qa;
      puVar3[1] = extraout_XMM0_Qb;
    }
  }
  return;
}

Assistant:

static inline void av1_round_shift_array_32_sse4_1(const __m128i *input,
                                                   __m128i *output,
                                                   const int size,
                                                   const int bit) {
  if (bit > 0) {
    int i;
    for (i = 0; i < size; i++) {
      output[i] = av1_round_shift_32_sse4_1(input[i], bit);
    }
  } else {
    int i;
    for (i = 0; i < size; i++) {
      output[i] = _mm_slli_epi32(input[i], -bit);
    }
  }
}